

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::StringFieldGenerator::GenerateMergeFromCodedStream
          (StringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Type TVar2;
  FileDescriptor *file;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "DO_(::google::protobuf::internal::WireFormatLite::Read$declared_type$(\n      input, this->mutable_$name$()));\n"
                    );
  file = FieldDescriptor::file(this->descriptor_);
  bVar1 = HasUtf8Verification(file);
  if ((bVar1) && (TVar2 = FieldDescriptor::type(this->descriptor_), TVar2 == TYPE_STRING)) {
    io::Printer::Print(printer,&this->variables_,
                       "::google::protobuf::internal::WireFormat::VerifyUTF8String(\n  this->$name$().data(), this->$name$().length(),\n  ::google::protobuf::internal::WireFormat::PARSE);\n"
                      );
  }
  return;
}

Assistant:

void StringFieldGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) const {
  printer->Print(variables_,
    "DO_(::google::protobuf::internal::WireFormatLite::Read$declared_type$(\n"
    "      input, this->mutable_$name$()));\n");
  if (HasUtf8Verification(descriptor_->file()) &&
      descriptor_->type() == FieldDescriptor::TYPE_STRING) {
    printer->Print(variables_,
      "::google::protobuf::internal::WireFormat::VerifyUTF8String(\n"
      "  this->$name$().data(), this->$name$().length(),\n"
      "  ::google::protobuf::internal::WireFormat::PARSE);\n");
  }
}